

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void print_lines3(string *text_)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  
  local_20._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_20;
  local_20._M_impl._M_node._M_size = 0;
  local_20._M_impl._M_node.super__List_node_base._M_prev =
       local_20._M_impl._M_node.super__List_node_base._M_next;
  just::lines::
  split<false,std::__cxx11::string,std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (text_,(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_20._M_impl._M_node.super__List_node_base._M_next);
  print<std::_List_iterator<std::__cxx11::string>>
            ((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_20._M_impl._M_node.super__List_node_base._M_next,(_List_node_base *)&local_20);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_20);
  return;
}

Assistant:

void print_lines3(const std::string& text_)
{
  std::list<std::string> v;
  just::lines::split(text_, v);
  print(v.begin(), v.end());
}